

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O0

void __thiscall
QO_Manager::QO_Manager
          (QO_Manager *this,QL_Manager *qlm,int nRelations,RelCatEntry *relations,int nAttributes,
          AttrCatEntry *attributes,int nConditions,Condition *conditions)

{
  undefined1 local_70 [8];
  map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_> mapper;
  int i;
  AttrCatEntry *attributes_local;
  int nAttributes_local;
  RelCatEntry *relations_local;
  int nRelations_local;
  QL_Manager *qlm_local;
  QO_Manager *this_local;
  
  this->qlm = qlm;
  std::
  vector<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
  ::vector(&this->optcost);
  for (mapper._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
      mapper._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ < nRelations;
      mapper._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           mapper._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
    std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>::
    map((map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_> *)
        local_70);
    std::
    vector<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
    ::push_back(&this->optcost,
                (map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
                 *)local_70);
    std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>::
    ~map((map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_> *
         )local_70);
  }
  this->nRels = nRelations;
  this->nAttrs = nAttributes;
  this->nConds = nConditions;
  this->rels = relations;
  this->attrs = attributes;
  this->conds = conditions;
  return;
}

Assistant:

QO_Manager::QO_Manager(QL_Manager &qlm, int nRelations, RelCatEntry *relations, int nAttributes, AttrCatEntry *attributes, 
    int nConditions, const Condition conditions[]) : qlm(qlm) {
  // Construct the new optjoin 
  for(int i=0; i < nRelations; i++){
    map<int, costElem*>  mapper;
    optcost.push_back(mapper);
  }

  nRels = nRelations;
  nAttrs = nAttributes;
  nConds = nConditions;
  rels = relations;
  attrs = attributes;
  conds = conditions;
}